

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_valid(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  uint uVar62;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing valid : 50 of 70 functions ...\n");
  }
  iVar1 = test_xmlAddAttributeDecl();
  iVar2 = test_xmlAddElementDecl();
  iVar3 = test_xmlAddID();
  iVar4 = test_xmlAddNotationDecl();
  iVar5 = test_xmlAddRef();
  iVar6 = test_xmlCopyAttributeTable();
  iVar7 = test_xmlCopyDocElementContent();
  iVar8 = test_xmlCopyElementContent();
  iVar9 = test_xmlCopyElementTable();
  iVar10 = test_xmlCopyEnumeration();
  iVar11 = test_xmlCopyNotationTable();
  iVar12 = test_xmlCreateEnumeration();
  iVar13 = test_xmlDumpAttributeDecl();
  iVar14 = test_xmlDumpAttributeTable();
  iVar15 = test_xmlDumpElementDecl();
  iVar16 = test_xmlDumpElementTable();
  iVar17 = test_xmlDumpNotationDecl();
  iVar18 = test_xmlDumpNotationTable();
  iVar19 = test_xmlGetDtdAttrDesc();
  iVar20 = test_xmlGetDtdElementDesc();
  iVar21 = test_xmlGetDtdNotationDesc();
  iVar22 = test_xmlGetDtdQAttrDesc();
  iVar23 = test_xmlGetDtdQElementDesc();
  iVar24 = test_xmlGetID();
  iVar25 = test_xmlGetRefs();
  iVar26 = test_xmlIsID();
  iVar27 = test_xmlIsMixedElement();
  iVar28 = test_xmlIsRef();
  iVar29 = test_xmlNewDocElementContent();
  iVar30 = test_xmlNewElementContent();
  iVar31 = test_xmlNewValidCtxt();
  iVar32 = test_xmlRemoveID();
  iVar33 = test_xmlRemoveRef();
  iVar34 = test_xmlSnprintfElementContent();
  iVar35 = test_xmlSprintfElementContent();
  iVar36 = test_xmlValidBuildContentModel();
  iVar37 = test_xmlValidCtxtNormalizeAttributeValue();
  iVar38 = test_xmlValidGetPotentialChildren();
  iVar39 = test_xmlValidGetValidElements();
  iVar40 = test_xmlValidNormalizeAttributeValue();
  iVar41 = test_xmlValidateAttributeDecl();
  iVar42 = test_xmlValidateAttributeValue();
  iVar43 = test_xmlValidateDocument();
  iVar44 = test_xmlValidateDocumentFinal();
  iVar45 = test_xmlValidateDtd();
  iVar46 = test_xmlValidateDtdFinal();
  iVar47 = test_xmlValidateElement();
  iVar48 = test_xmlValidateElementDecl();
  iVar49 = test_xmlValidateNameValue();
  iVar50 = test_xmlValidateNamesValue();
  iVar51 = test_xmlValidateNmtokenValue();
  iVar52 = test_xmlValidateNmtokensValue();
  iVar53 = test_xmlValidateNotationDecl();
  iVar54 = test_xmlValidateNotationUse();
  iVar55 = test_xmlValidateOneAttribute();
  iVar56 = test_xmlValidateOneElement();
  iVar57 = test_xmlValidateOneNamespace();
  iVar58 = test_xmlValidatePopElement();
  iVar59 = test_xmlValidatePushCData();
  iVar60 = test_xmlValidatePushElement();
  iVar61 = test_xmlValidateRoot();
  uVar62 = iVar61 + iVar60 + iVar59 + iVar58 + iVar57 + iVar56 + iVar55 + iVar54 + iVar53 + iVar52 +
                                                                                            iVar51 +
                                                                                            iVar50 +
                                                                                            iVar49 +
                                                                                            iVar48 +
                                                                                            iVar47 +
                                                                                            iVar46 +
                                                                                            iVar45 +
                                                                                            iVar44 +
                                                                                            iVar43 +
                                                                                            iVar42 +
                                                                                            iVar41 +
                                                                                            iVar40 +
                                                                                            iVar39 +
                                                                                            iVar38 +
                                                                                            iVar37 +
                                                                                            iVar36 +
                                                                                            iVar35 +
                                                                                            iVar34 +
                                                                                            iVar33 +
                                                                                            iVar32 +
                                                                                            iVar31 +
                                                                                            iVar30 +
                                                                                            iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar62 != 0) {
    printf("Module valid: %d errors\n",(ulong)uVar62);
  }
  return uVar62;
}

Assistant:

static int
test_valid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing valid : 50 of 70 functions ...\n");
    test_ret += test_xmlAddAttributeDecl();
    test_ret += test_xmlAddElementDecl();
    test_ret += test_xmlAddID();
    test_ret += test_xmlAddNotationDecl();
    test_ret += test_xmlAddRef();
    test_ret += test_xmlCopyAttributeTable();
    test_ret += test_xmlCopyDocElementContent();
    test_ret += test_xmlCopyElementContent();
    test_ret += test_xmlCopyElementTable();
    test_ret += test_xmlCopyEnumeration();
    test_ret += test_xmlCopyNotationTable();
    test_ret += test_xmlCreateEnumeration();
    test_ret += test_xmlDumpAttributeDecl();
    test_ret += test_xmlDumpAttributeTable();
    test_ret += test_xmlDumpElementDecl();
    test_ret += test_xmlDumpElementTable();
    test_ret += test_xmlDumpNotationDecl();
    test_ret += test_xmlDumpNotationTable();
    test_ret += test_xmlGetDtdAttrDesc();
    test_ret += test_xmlGetDtdElementDesc();
    test_ret += test_xmlGetDtdNotationDesc();
    test_ret += test_xmlGetDtdQAttrDesc();
    test_ret += test_xmlGetDtdQElementDesc();
    test_ret += test_xmlGetID();
    test_ret += test_xmlGetRefs();
    test_ret += test_xmlIsID();
    test_ret += test_xmlIsMixedElement();
    test_ret += test_xmlIsRef();
    test_ret += test_xmlNewDocElementContent();
    test_ret += test_xmlNewElementContent();
    test_ret += test_xmlNewValidCtxt();
    test_ret += test_xmlRemoveID();
    test_ret += test_xmlRemoveRef();
    test_ret += test_xmlSnprintfElementContent();
    test_ret += test_xmlSprintfElementContent();
    test_ret += test_xmlValidBuildContentModel();
    test_ret += test_xmlValidCtxtNormalizeAttributeValue();
    test_ret += test_xmlValidGetPotentialChildren();
    test_ret += test_xmlValidGetValidElements();
    test_ret += test_xmlValidNormalizeAttributeValue();
    test_ret += test_xmlValidateAttributeDecl();
    test_ret += test_xmlValidateAttributeValue();
    test_ret += test_xmlValidateDocument();
    test_ret += test_xmlValidateDocumentFinal();
    test_ret += test_xmlValidateDtd();
    test_ret += test_xmlValidateDtdFinal();
    test_ret += test_xmlValidateElement();
    test_ret += test_xmlValidateElementDecl();
    test_ret += test_xmlValidateNameValue();
    test_ret += test_xmlValidateNamesValue();
    test_ret += test_xmlValidateNmtokenValue();
    test_ret += test_xmlValidateNmtokensValue();
    test_ret += test_xmlValidateNotationDecl();
    test_ret += test_xmlValidateNotationUse();
    test_ret += test_xmlValidateOneAttribute();
    test_ret += test_xmlValidateOneElement();
    test_ret += test_xmlValidateOneNamespace();
    test_ret += test_xmlValidatePopElement();
    test_ret += test_xmlValidatePushCData();
    test_ret += test_xmlValidatePushElement();
    test_ret += test_xmlValidateRoot();

    if (test_ret != 0)
	printf("Module valid: %d errors\n", test_ret);
    return(test_ret);
}